

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

float * __thiscall
itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::choose_data
          (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this,size_t desired_capacity)

{
  float *pfVar1;
  pointer pfVar2;
  ulong __n;
  
  pfVar1 = this->m_dynamic_data;
  if (this->m_begin == pfVar1) {
    __n = this->m_dynamic_capacity;
    if (desired_capacity <= __n) {
      return pfVar1;
    }
    while (__n < desired_capacity) {
      __n = __n * 3 + 1 >> 1;
      this->m_dynamic_capacity = __n;
    }
  }
  else {
    if (desired_capacity < 5) {
      return (float *)this->m_static_data;
    }
    if (desired_capacity <= this->m_dynamic_capacity) {
      return pfVar1;
    }
    if (pfVar1 != (float *)0x0) {
      operator_delete(pfVar1,this->m_dynamic_capacity << 2);
    }
    this->m_dynamic_capacity = desired_capacity;
    __n = desired_capacity;
  }
  pfVar2 = Catch::clara::std::allocator_traits<std::allocator<float>_>::allocate
                     ((allocator_type *)this,__n);
  this->m_dynamic_data = pfVar2;
  return pfVar2;
}

Assistant:

T* choose_data(size_t desired_capacity)
    {
        if (m_begin == m_dynamic_data)
        {
            // we're at the dyn buffer, so see if it needs resize or revert to static

            if (desired_capacity > m_dynamic_capacity)
            {
                while (m_dynamic_capacity < desired_capacity)
                {
                    // grow by roughly 1.5
                    m_dynamic_capacity *= 3;
                    ++m_dynamic_capacity;
                    m_dynamic_capacity /= 2;
                }

                m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
                return m_dynamic_data;
            }
            else if (desired_capacity < RevertToStaticSize)
            {
                // we're reverting to the static buffer
                return static_begin_ptr();
            }
            else
            {
                // if the capacity and we don't revert to static, just do nothing
                return m_dynamic_data;
            }
        }
        else
        {
            assert(m_begin == static_begin_ptr()); // corrupt begin ptr?

            if (desired_capacity > StaticCapacity)
            {
                // we must move to dyn memory

                // see if we have enough
                if (desired_capacity > m_dynamic_capacity)
                {
                    // we need to allocate more
                    // we don't have anything to destroy, so we can also deallocate the buffer
                    if (m_dynamic_data)
                    {
                        atraits::deallocate(get_alloc(), m_dynamic_data, m_dynamic_capacity);
                    }

                    m_dynamic_capacity = desired_capacity;
                    m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
                }

                return m_dynamic_data;
            }
            else
            {
                // we have enough capacity as it is
                return static_begin_ptr();
            }
        }
    }